

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Target.hpp
# Opt level: O1

void __thiscall Analyser::Static::ZX8081::Target::Target(Target *this)

{
  StructImpl<Analyser::Static::ZX8081::Target> *this_00;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  string local_40;
  
  (this->super_Target).state._M_t.
  super___uniq_ptr_impl<Reflection::Struct,_std::default_delete<Reflection::Struct>_>._M_t.
  super__Tuple_impl<0UL,_Reflection::Struct_*,_std::default_delete<Reflection::Struct>_>.
  super__Head_base<0UL,_Reflection::Struct_*,_false>._M_head_impl = (Struct *)0x0;
  (this->super_Target).machine = ZX8081;
  (this->super_Target).media.disks.
  super__Vector_base<std::shared_ptr<Storage::Disk::Disk>,_std::allocator<std::shared_ptr<Storage::Disk::Disk>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->super_Target).media.disks.
  super__Vector_base<std::shared_ptr<Storage::Disk::Disk>,_std::allocator<std::shared_ptr<Storage::Disk::Disk>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->super_Target).media.disks.
  super__Vector_base<std::shared_ptr<Storage::Disk::Disk>,_std::allocator<std::shared_ptr<Storage::Disk::Disk>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->super_Target).media.tapes.
  super__Vector_base<std::shared_ptr<Storage::Tape::Tape>,_std::allocator<std::shared_ptr<Storage::Tape::Tape>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->super_Target).media.tapes.
  super__Vector_base<std::shared_ptr<Storage::Tape::Tape>,_std::allocator<std::shared_ptr<Storage::Tape::Tape>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->super_Target).media.tapes.
  super__Vector_base<std::shared_ptr<Storage::Tape::Tape>,_std::allocator<std::shared_ptr<Storage::Tape::Tape>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->super_Target).media.cartridges.
  super__Vector_base<std::shared_ptr<Storage::Cartridge::Cartridge>,_std::allocator<std::shared_ptr<Storage::Cartridge::Cartridge>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->super_Target).media.cartridges.
  super__Vector_base<std::shared_ptr<Storage::Cartridge::Cartridge>,_std::allocator<std::shared_ptr<Storage::Cartridge::Cartridge>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->super_Target).media.cartridges.
  super__Vector_base<std::shared_ptr<Storage::Cartridge::Cartridge>,_std::allocator<std::shared_ptr<Storage::Cartridge::Cartridge>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->super_Target).media.mass_storage_devices.
  super__Vector_base<std::shared_ptr<Storage::MassStorage::MassStorageDevice>,_std::allocator<std::shared_ptr<Storage::MassStorage::MassStorageDevice>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->super_Target).media.mass_storage_devices.
  super__Vector_base<std::shared_ptr<Storage::MassStorage::MassStorageDevice>,_std::allocator<std::shared_ptr<Storage::MassStorage::MassStorageDevice>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->super_Target).media.mass_storage_devices.
  super__Vector_base<std::shared_ptr<Storage::MassStorage::MassStorageDevice>,_std::allocator<std::shared_ptr<Storage::MassStorage::MassStorageDevice>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->super_Target).confidence = 0.0;
  (this->super_Target)._vptr_Target = (_func_int **)&PTR__Target_00597050;
  (this->super_StructImpl<Analyser::Static::ZX8081::Target>).super_Struct._vptr_Struct =
       (_func_int **)&PTR_all_keys_abi_cxx11__00597070;
  this->memory_model = Unexpanded;
  this->is_ZX81 = false;
  this->ZX80_uses_ZX81_ROM = false;
  (this->loading_command)._M_dataplus._M_p = (pointer)&(this->loading_command).field_2;
  (this->loading_command)._M_string_length = 0;
  (this->loading_command).field_2._M_local_buf[0] = '\0';
  if (Reflection::StructImpl<Analyser::Static::ZX8081::Target>::contents__abi_cxx11_._M_h.
      _M_element_count == 0) {
    paVar1 = &local_40.field_2;
    local_40._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_40,"memory_model","");
    this_00 = &this->super_StructImpl<Analyser::Static::ZX8081::Target>;
    Reflection::StructImpl<Analyser::Static::ZX8081::Target>::
    declare_emplace<Analyser::Static::ZX8081::Target::MemoryModel>
              (this_00,&this->memory_model,&local_40,1);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_40._M_dataplus._M_p != paVar1) {
      operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
    }
    local_40._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_40,"is_ZX81","");
    Reflection::StructImpl<Analyser::Static::ZX8081::Target>::declare_emplace<bool>
              (this_00,&this->is_ZX81,&local_40,1);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_40._M_dataplus._M_p != paVar1) {
      operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
    }
    local_40._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_40,"ZX80_uses_ZX81_ROM","");
    Reflection::StructImpl<Analyser::Static::ZX8081::Target>::declare_emplace<bool>
              (this_00,&this->ZX80_uses_ZX81_ROM,&local_40,1);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_40._M_dataplus._M_p != paVar1) {
      operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
    }
    Reflection::Enum::declare<Analyser::Static::ZX8081::Target::MemoryModel>
              ("MemoryModel","Unexpanded, SixteenKB, SixtyFourKB");
  }
  return;
}

Assistant:

Target(): Analyser::Static::Target(Machine::ZX8081) {
		if(needs_declare()) {
			DeclareField(memory_model);
			DeclareField(is_ZX81);
			DeclareField(ZX80_uses_ZX81_ROM);
			AnnounceEnum(MemoryModel);
		}
	}